

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O3

void anon_unknown.dwarf_23d889::generatePixel(int i,int j,half *rgbaValue,bool pIsLeft)

{
  float i_00;
  float fVar1;
  uint uVar2;
  unsigned_short uVar3;
  undefined7 in_register_00000009;
  uint uVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  
  fVar9 = (float)j;
  if ((int)CONCAT71(in_register_00000009,pIsLeft) == 0) {
    fVar5 = fVar9 * 0.005 + (float)((j * i) % 10);
    uVar2 = i * 2;
    uVar4 = i * i + j;
    iVar6 = (int)((ulong)uVar2 * 0x66666667 >> 0x20) - (-(uint)((int)uVar2 < 0) & 0x66666667);
    iVar7 = (int)((ulong)uVar4 * 0x66666667 >> 0x20) - (-(uint)((int)uVar4 < 0) & 0x66666667);
    iVar6 = uVar2 + ((iVar6 >> 2) - (iVar6 >> 0x1f)) * -10;
    iVar7 = uVar4 + ((iVar7 >> 2) - (iVar7 >> 0x1f)) * -10;
    fVar8 = 0.007;
    fVar1 = 0.006;
  }
  else {
    fVar5 = fVar9 * 0.004 + (float)((j + i) % 10);
    uVar2 = j * 2;
    uVar4 = j * j + i;
    iVar6 = (int)((ulong)uVar2 * 0x66666667 >> 0x20) - (-(uint)((int)uVar2 < 0) & 0x66666667);
    iVar7 = (int)((ulong)uVar4 * 0x66666667 >> 0x20) - (-(uint)((int)uVar4 < 0) & 0x66666667);
    iVar6 = uVar2 + ((iVar6 >> 2) - (iVar6 >> 0x1f)) * -10;
    iVar7 = uVar4 + ((iVar7 >> 2) - (iVar7 >> 0x1f)) * -10;
    fVar8 = 0.006;
    fVar1 = 0.003;
  }
  i_00 = half::_toFloat[(anonymous_namespace)::ALPHA_DEFAULT_VALUE].f;
  fVar8 = ((float)i * fVar8 + (float)iVar6) / 10.0;
  fVar5 = fVar5 / 10.0;
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    if (half::_eLut[(uint)fVar5 >> 0x17] == 0) {
      uVar3 = half::convert((int)fVar5);
    }
    else {
      uVar3 = half::_eLut[(uint)fVar5 >> 0x17] +
              (short)(((uint)fVar5 & 0x7fffff) + 0xfff + (uint)(((uint)fVar5 >> 0xd & 1) != 0) >>
                     0xd);
    }
  }
  else {
    uVar3 = (unsigned_short)((uint)fVar5 >> 0x10);
  }
  fVar9 = (fVar9 * fVar1 + (float)iVar7) / 10.0;
  rgbaValue->_h = uVar3;
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    if (half::_eLut[(uint)fVar8 >> 0x17] == 0) {
      uVar3 = half::convert((int)fVar8);
    }
    else {
      uVar3 = half::_eLut[(uint)fVar8 >> 0x17] +
              (short)(((uint)fVar8 & 0x7fffff) + 0xfff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >>
                     0xd);
    }
  }
  else {
    uVar3 = (unsigned_short)((uint)fVar8 >> 0x10);
  }
  rgbaValue[1]._h = uVar3;
  if ((fVar9 != 0.0) || (NAN(fVar9))) {
    if (half::_eLut[(uint)fVar9 >> 0x17] == 0) {
      uVar3 = half::convert((int)fVar9);
    }
    else {
      uVar3 = half::_eLut[(uint)fVar9 >> 0x17] +
              (short)(((uint)fVar9 & 0x7fffff) + 0xfff + (uint)(((uint)fVar9 >> 0xd & 1) != 0) >>
                     0xd);
    }
  }
  else {
    uVar3 = (unsigned_short)((uint)fVar9 >> 0x10);
  }
  rgbaValue[2]._h = uVar3;
  if ((i_00 != 0.0) || (NAN(i_00))) {
    if (half::_eLut[(uint)i_00 >> 0x17] == 0) {
      uVar3 = half::convert((int)i_00);
    }
    else {
      uVar3 = half::_eLut[(uint)i_00 >> 0x17] +
              (short)(((uint)i_00 & 0x7fffff) + 0xfff + (uint)(((uint)i_00 >> 0xd & 1) != 0) >> 0xd)
      ;
    }
  }
  else {
    uVar3 = (unsigned_short)((uint)i_00 >> 0x10);
  }
  rgbaValue[3]._h = uVar3;
  return;
}

Assistant:

void
generatePixel (int i, int j, half* rgbaValue, bool pIsLeft)
{
    float redValue = 0.0f;
    float greenValue = 0.0f;
    float blueValue = 0.0f;
    float alphaValue = 0.0f;

    // These formulas are arbitrary but generate results that vary
    // depending on pixel position.  They are used to validate that
    // pixels are read/written correctly, because if we had only one
    // value for the whole image, the tests would still pass if we read
    // only one pixel and copied it all across the buffer.
    if(pIsLeft)
    {
        redValue = ((i + j) % 10 + 0.004f * j) / 10.0f;
        greenValue = ((j + j) % 10 + 0.006f * i) / 10.0f;
        blueValue = ((j * j + i) % 10 + 0.003f * j) / 10.0f;
        alphaValue = ALPHA_DEFAULT_VALUE;
    }
    else
    {
        redValue = ((i * j) % 10 + 0.005f * j) / 10.0f;
        greenValue = ((i + i) % 10 + 0.007f * i) / 10.0f;
        blueValue = ((i * i + j) % 10 + 0.006f * j) / 10.0f;
        alphaValue = ALPHA_DEFAULT_VALUE;
    }


    rgbaValue[0] = redValue;
    rgbaValue[1] = greenValue;
    rgbaValue[2] = blueValue;
    rgbaValue[3] = alphaValue;
}